

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_SetVisibleRotation
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  PClass *pPVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 extraout_var;
  PClass *pPVar9;
  VMValue *pVVar10;
  AActor *pAVar11;
  char *pcVar12;
  bool bVar13;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar12 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar11 = (AActor *)(param->field_0).field_1.a;
      if (pAVar11 != (AActor *)0x0) {
        if ((pAVar11->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar7 = (**(pAVar11->super_DThinker).super_DObject._vptr_DObject)(pAVar11);
          (pAVar11->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar7);
        }
        pPVar9 = (pAVar11->super_DThinker).super_DObject.Class;
        bVar13 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar6 && bVar13) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar13 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar6) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (!bVar13) {
          pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e248e;
        }
      }
      if (numparam == 1) {
        pVVar10 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\x01') {
          pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e24cc:
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a77,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar10 = param;
        if (param[1].field_0.field_3.Type != '\x01') {
          pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
          goto LAB_003e24cc;
        }
      }
      pvVar1 = pVVar10[1].field_0.field_1.a;
      if (numparam < 3) {
        pVVar10 = defaultparam->Array;
        if (pVVar10[2].field_0.field_3.Type != '\x01') {
          pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          goto LAB_003e24eb;
        }
      }
      else {
        pVVar10 = param;
        if (param[2].field_0.field_3.Type != '\x01') {
          pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003e24eb:
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a78,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      pvVar2 = pVVar10[2].field_0.field_1.a;
      if (numparam < 4) {
        pVVar10 = defaultparam->Array;
        if (pVVar10[3].field_0.field_3.Type != '\x01') {
          pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          goto LAB_003e250a;
        }
      }
      else {
        pVVar10 = param;
        if (param[3].field_0.field_3.Type != '\x01') {
          pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003e250a:
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a79,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      pvVar3 = pVVar10[3].field_0.field_1.a;
      if (numparam < 5) {
        pVVar10 = defaultparam->Array;
        if (pVVar10[4].field_0.field_3.Type != '\x01') {
          pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          goto LAB_003e2529;
        }
      }
      else {
        pVVar10 = param;
        if (param[4].field_0.field_3.Type != '\x01') {
          pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003e2529:
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a7a,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      pvVar4 = pVVar10[4].field_0.field_1.a;
      if (numparam < 6) {
        pVVar10 = defaultparam->Array;
        if (pVVar10[5].field_0.field_3.Type != '\0') {
          pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003e2548;
        }
      }
      else {
        pVVar10 = param;
        if (param[5].field_0.field_3.Type != '\0') {
          pcVar12 = "(param[paramnum]).Type == REGT_INT";
LAB_003e2548:
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a7b,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      uVar5 = pVVar10[5].field_0.i;
      if (numparam < 7) {
        param = defaultparam->Array;
        if (param[6].field_0.field_3.Type != '\0') {
          pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003e2567;
        }
      }
      else if (param[6].field_0.field_3.Type != '\0') {
        pcVar12 = "(param[paramnum]).Type == REGT_INT";
LAB_003e2567:
        __assert_fail(pcVar12,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1a7c,
                      "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pAVar11 = COPY_AAPTR(pAVar11,param[6].field_0.i);
      if (pAVar11 == (AActor *)0x0) {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a82,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        uVar8 = 0;
      }
      else {
        if ((uVar5 & 1) == 0) {
          (pAVar11->VisibleStartAngle).Degrees = (double)pvVar1;
        }
        if ((uVar5 & 2) == 0) {
          (pAVar11->VisibleEndAngle).Degrees = (double)pvVar2;
        }
        if ((uVar5 & 4) == 0) {
          (pAVar11->VisibleStartPitch).Degrees = (double)pvVar3;
        }
        if ((uVar5 & 8) == 0) {
          (pAVar11->VisibleEndPitch).Degrees = (double)pvVar4;
        }
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a96,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        uVar8 = 1;
      }
      if (ret->RegType != '\0') {
        __assert_fail("RegType == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                      ,0x13f,"void VMReturn::SetInt(int)");
      }
      *(undefined4 *)ret->Location = uVar8;
      return 1;
    }
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e248e:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1a76,
                "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetVisibleRotation)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF(anglestart)
	PARAM_ANGLE_DEF(angleend)	
	PARAM_ANGLE_DEF(pitchstart)
	PARAM_ANGLE_DEF(pitchend)	
	PARAM_INT_DEF(flags)		
	PARAM_INT_DEF(ptr)			

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (mobj == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}
		
	if (!(flags & VRF_NOANGLESTART))
	{
		mobj->VisibleStartAngle = anglestart;
	}
	if (!(flags & VRF_NOANGLEEND))
	{
		mobj->VisibleEndAngle = angleend;
	}
	if (!(flags & VRF_NOPITCHSTART))
	{
		mobj->VisibleStartPitch = pitchstart;
	}
	if (!(flags & VRF_NOPITCHEND))
	{
		mobj->VisibleEndPitch = pitchend;
	}

	ACTION_RETURN_BOOL(true);
}